

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CrossSite.cpp
# Opt level: O0

void Js::CrossSite::ForceCrossSiteThunkOnPrototypeChain(RecyclableObject *object)

{
  bool bVar1;
  TypeId typeId;
  int iVar2;
  BOOL BVar3;
  DynamicObject *this;
  byte local_19;
  DynamicObject *dynamicObject;
  RecyclableObject *object_local;
  
  bVar1 = TaggedNumber::Is(object);
  dynamicObject = (DynamicObject *)object;
  if (!bVar1) {
    while( true ) {
      typeId = RecyclableObject::GetTypeId(&dynamicObject->super_RecyclableObject);
      bVar1 = DynamicType::Is(typeId);
      local_19 = 0;
      if (bVar1) {
        bVar1 = VarIs<Js::JavascriptProxy,Js::RecyclableObject>
                          (&dynamicObject->super_RecyclableObject);
        local_19 = bVar1 ^ 0xff;
      }
      if ((local_19 & 1) == 0) break;
      this = UnsafeVarTo<Js::DynamicObject,Js::RecyclableObject>
                       (&dynamicObject->super_RecyclableObject);
      iVar2 = (*(this->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject[0x66])();
      if ((iVar2 == 0) &&
         (BVar3 = RecyclableObject::IsExternal(&this->super_RecyclableObject), BVar3 == 0)) {
        (*(this->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
          _vptr_IRecyclerVisitedObject[0x61])(this,0);
      }
      dynamicObject =
           (DynamicObject *)RecyclableObject::GetPrototype(&dynamicObject->super_RecyclableObject);
    }
  }
  return;
}

Assistant:

void CrossSite::ForceCrossSiteThunkOnPrototypeChain(RecyclableObject* object)
    {
        if (TaggedNumber::Is(object))
        {
            return;
        }
        while (DynamicType::Is(object->GetTypeId()) && !VarIs<JavascriptProxy>(object))
        {
            DynamicObject* dynamicObject = UnsafeVarTo<DynamicObject>(object);
            if (!dynamicObject->IsCrossSiteObject() && !dynamicObject->IsExternal())
            {
                // force to install cross-site thunk on prototype objects.
                dynamicObject->MarshalToScriptContext(nullptr);
            }
            object = object->GetPrototype();
        }
        return;

    }